

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsBuilder.cpp
# Opt level: O2

void __thiscall
Refal2::COperationsBuilder::AddMatchRight_W
          (COperationsBuilder *this,CQualifier *qualifier,bool saveInTable)

{
  bool bVar1;
  
  bVar1 = CQualifier::IsEmpty(qualifier);
  if (bVar1) {
    addOperation(this,saveInTable + OT_MatchRight_W);
    return;
  }
  addQualifierIndexOperation(this,saveInTable + OT_MatchRightWithQualifier_W,qualifier);
  return;
}

Assistant:

void COperationsBuilder::AddMatchRight_W( CQualifier& qualifier,
	bool saveInTable )
{
	DEBUG_PRINT( __FUNCTION__ )
	if( qualifier.IsEmpty() ) {
		addNoArgumensOperation(
			( saveInTable ? OT_MatchRightSaveToTable_W : OT_MatchRight_W ) );
	} else {
		addQualifierIndexOperation(
			( saveInTable ? OT_MatchRightWithQualifierSaveToTable_W :
			 OT_MatchRightWithQualifier_W ), qualifier );
	}
}